

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e0a3::BuildEngineTest_StatusCallbacks_Test::TestBody
          (BuildEngineTest_StatusCallbacks_Test *this)

{
  initializer_list<llbuild::core::KeyType> __l;
  bool bVar1;
  SimpleRule *pSVar2;
  ValueType *value;
  char *pcVar3;
  KeyType *local_2c8;
  AssertHelper local_2c0;
  Message local_2b8;
  uint local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_2;
  Message local_290;
  uint local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_1;
  Message local_268;
  KeyType local_260;
  int32_t local_240;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  anon_class_16_2_c81d58e0 local_220;
  StatusFnType local_210;
  function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)> local_1f0;
  anon_class_1_0_00000001 local_1c9;
  ComputeFnType local_1c8;
  allocator<llbuild::core::KeyType> local_1a1;
  KeyType local_1a0;
  iterator local_180;
  size_type local_178;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_170;
  KeyType local_158;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_138;
  CommandSignature local_130;
  anon_class_16_2_c81d58e0 local_128;
  StatusFnType local_118;
  function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)> local_f8;
  anon_class_1_0_00000001 local_d1;
  ComputeFnType local_d0;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_b0;
  KeyType local_98;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_78;
  BuildEngine local_70;
  BuildEngine engine;
  SimpleBuildEngineDelegate delegate;
  uint numComplete;
  uint numScanned;
  BuildEngineTest_StatusCallbacks_Test *this_local;
  
  delegate._76_4_ = 0;
  delegate.expectedError = false;
  delegate._73_3_ = 0;
  SimpleBuildEngineDelegate::SimpleBuildEngineDelegate((SimpleBuildEngineDelegate *)&engine);
  llbuild::core::BuildEngine::BuildEngine(&local_70,(BuildEngineDelegate *)&engine);
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  llbuild::core::KeyType::KeyType(&local_98,"input");
  memset(&local_b0,0,0x18);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector(&local_b0);
  std::function<int(std::vector<int,std::allocator<int>>const&)>::
  function<(anonymous_namespace)::BuildEngineTest_StatusCallbacks_Test::TestBody()::__0,void>
            ((function<int(std::vector<int,std::allocator<int>>const&)> *)&local_d0,&local_d1);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::function
            (&local_f8,(nullptr_t)0x0);
  local_128.numScanned = (uint *)&delegate.field_0x4c;
  local_128.numComplete = (uint *)&delegate.expectedError;
  std::function<void(llbuild::core::Rule::StatusKind)>::
  function<(anonymous_namespace)::BuildEngineTest_StatusCallbacks_Test::TestBody()::__1,void>
            ((function<void(llbuild::core::Rule::StatusKind)> *)&local_118,&local_128);
  memset(&local_130,0,8);
  llbuild::basic::CommandSignature::CommandSignature(&local_130);
  SimpleRule::SimpleRule(pSVar2,&local_98,&local_b0,&local_d0,&local_f8,&local_118,&local_130);
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)&local_78,
             (pointer)pSVar2);
  llbuild::core::BuildEngine::addRule(&local_70,&local_78);
  std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
            (&local_78);
  std::function<void_(llbuild::core::Rule::StatusKind)>::~function(&local_118);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::
  ~function(&local_f8);
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_d0);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_b0);
  llbuild::core::KeyType::~KeyType(&local_98);
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  llbuild::core::KeyType::KeyType(&local_158,"output");
  llbuild::core::KeyType::KeyType(&local_1a0,"input");
  local_180 = &local_1a0;
  local_178 = 1;
  std::allocator<llbuild::core::KeyType>::allocator(&local_1a1);
  __l._M_len = local_178;
  __l._M_array = local_180;
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector
            (&local_170,__l,&local_1a1);
  std::function<int(std::vector<int,std::allocator<int>>const&)>::
  function<(anonymous_namespace)::BuildEngineTest_StatusCallbacks_Test::TestBody()::__2,void>
            ((function<int(std::vector<int,std::allocator<int>>const&)> *)&local_1c8,&local_1c9);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::function
            (&local_1f0,(nullptr_t)0x0);
  local_220.numScanned = (uint *)&delegate.field_0x4c;
  local_220.numComplete = (uint *)&delegate.expectedError;
  std::function<void(llbuild::core::Rule::StatusKind)>::
  function<(anonymous_namespace)::BuildEngineTest_StatusCallbacks_Test::TestBody()::__3,void>
            ((function<void(llbuild::core::Rule::StatusKind)> *)&local_210,&local_220);
  memset(&gtest_ar.message_,0,8);
  llbuild::basic::CommandSignature::CommandSignature((CommandSignature *)&gtest_ar.message_);
  SimpleRule::SimpleRule
            (pSVar2,&local_158,&local_170,&local_1c8,&local_1f0,&local_210,
             (CommandSignature *)&gtest_ar.message_);
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)&local_138,
             (pointer)pSVar2);
  llbuild::core::BuildEngine::addRule(&local_70,&local_138);
  std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
            (&local_138);
  std::function<void_(llbuild::core::Rule::StatusKind)>::~function(&local_210);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::
  ~function(&local_1f0);
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_1c8);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_170);
  std::allocator<llbuild::core::KeyType>::~allocator(&local_1a1);
  local_2c8 = (KeyType *)&local_180;
  do {
    local_2c8 = local_2c8 + -1;
    llbuild::core::KeyType::~KeyType(local_2c8);
  } while (local_2c8 != &local_1a0);
  llbuild::core::KeyType::~KeyType(&local_158);
  local_23c = 6;
  llbuild::core::KeyType::KeyType(&local_260,"output");
  value = llbuild::core::BuildEngine::build(&local_70,&local_260);
  local_240 = intFromValue(value);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_238,"2 * 3","intFromValue(engine.build(\"output\"))",&local_23c,
             &local_240);
  llbuild::core::KeyType::~KeyType(&local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x2f4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_284 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_280,"2U","numScanned",&local_284,(uint *)&delegate.field_0x4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x2f5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  local_2ac = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_2a8,"2U","numComplete",&local_2ac,(uint *)&delegate.expectedError);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x2f6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  llbuild::core::BuildEngine::~BuildEngine(&local_70);
  SimpleBuildEngineDelegate::~SimpleBuildEngineDelegate((SimpleBuildEngineDelegate *)&engine);
  return;
}

Assistant:

TEST(BuildEngineTest, StatusCallbacks) {
  unsigned numScanned = 0;
  unsigned numComplete = 0;
  SimpleBuildEngineDelegate delegate;
  core::BuildEngine engine(delegate);
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "input", {}, [&] (const std::vector<int>& inputs) {
          return 2; },
      nullptr,
      [&] (core::Rule::StatusKind status) {
        if (status == core::Rule::StatusKind::IsScanning) {
          ++numScanned;
        } else {
          assert(status == core::Rule::StatusKind::IsComplete);
          ++numComplete;
        }
      } )));
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "output", {"input"},
                   [&] (const std::vector<int>& inputs) {
                     return inputs[0] * 3;
                   },
      nullptr,
      [&] (core::Rule::StatusKind status) {
        if (status == core::Rule::StatusKind::IsScanning) {
          ++numScanned;
        } else {
          assert(status == core::Rule::StatusKind::IsComplete);
          ++numComplete;
        }
      } )));

  // Build the result.
  EXPECT_EQ(2 * 3, intFromValue(engine.build("output")));
  EXPECT_EQ(2U, numScanned);
  EXPECT_EQ(2U, numComplete);
}